

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O3

Col_Word Col_NewRope(Col_StringFormat format,void *data,size_t byteLength)

{
  uint uVar1;
  ulong in_RAX;
  ulong __n;
  ulong uVar2;
  Cell *pacVar3;
  Col_Word CVar4;
  Col_Word right;
  ulong uVar5;
  Col_Char4 *string;
  uint uVar6;
  char *__dest;
  undefined2 uVar7;
  short sVar8;
  Col_Char2 *pCVar9;
  size_t byteLength_00;
  undefined8 local_38;
  
  if (byteLength == 0) {
    return 0xc;
  }
  local_38 = in_RAX;
  if ((format & 0x10) != 0) {
    if (0xfda < byteLength) {
      pCVar9 = (Col_Char2 *)
               (((byteLength / (format & (COL_UCS4|COL_UCS2|COL_UCS1)) >> 1) + 1) *
                (ulong)(format & (COL_UCS4|COL_UCS2|COL_UCS1)) + (long)data);
      if (format == COL_UTF16) {
        pCVar9 = Col_Utf16Prev(pCVar9);
      }
      else if (format == COL_UTF8) {
        pCVar9 = (Col_Char2 *)Col_Utf8Prev((Col_Char1 *)pCVar9);
      }
      byteLength_00 = (long)pCVar9 - (long)data;
      goto LAB_00108cba;
    }
    sVar8 = 0;
    pCVar9 = (Col_Char2 *)data;
    do {
      if (format == COL_UTF16) {
        pCVar9 = Col_Utf16Next(pCVar9);
      }
      else if (format == COL_UTF8) {
        pCVar9 = (Col_Char2 *)Col_Utf8Next((Col_Char1 *)pCVar9);
      }
      sVar8 = sVar8 + 1;
    } while (pCVar9 < (Col_Char2 *)((long)data + byteLength));
    pacVar3 = AllocCells(byteLength + 0x25 >> 5);
    (*pacVar3)[0] = '\n';
    (*pacVar3)[1] = (char)format;
    *(short *)(*pacVar3 + 2) = sVar8;
    *(short *)(*pacVar3 + 4) = (short)byteLength;
    __dest = *pacVar3 + 6;
    goto LAB_00108c96;
  }
  uVar5 = (ulong)(format & (COL_UCS4|COL_UCS2|COL_UCS1));
  __n = byteLength / uVar5;
  uVar7 = (undefined2)__n;
  if (__n == 1) {
    if ((int)format < 4) {
      if (format == COL_UCS1) {
        return (ulong)*data << 8 | 0x24;
      }
      if (format == COL_UCS2) {
        return (ulong)*data << 8 | 0x44;
      }
    }
    else {
      if (format == COL_UCS4) {
        return (ulong)*data << 8 | 0x84;
      }
      if (format == 0x24) {
        uVar6 = *data;
        if (uVar6 < 0x100) {
          uVar1 = uVar6 << 8 | 0x24;
        }
        else if (uVar6 < 0x10000) {
          uVar1 = uVar6 << 8 | 0x44;
        }
        else {
          uVar1 = 0xc;
          if (uVar6 < 0x110000) {
            uVar1 = uVar6 << 8 | 0x84;
          }
        }
        return (ulong)uVar1;
      }
    }
LAB_00108c76:
    pacVar3 = AllocCells(byteLength + 0x23 >> 5);
    (*pacVar3)[0] = '\x06';
    (*pacVar3)[1] = (char)format;
  }
  else {
    if (__n < 8) {
      if (format != 0x24) {
        if (format == COL_UCS1) {
          local_38 = __n << 5 | 0xc;
          memcpy((void *)((long)&local_38 + 1),data,__n);
          return local_38;
        }
        goto LAB_00108c76;
      }
      local_38 = __n << 5 | 0xc;
      uVar2 = 0;
      if (uVar5 <= byteLength) {
        do {
          uVar6 = *(uint *)((long)data + uVar2 * 4);
          if (0xff < uVar6) break;
          *(char *)((long)&local_38 + uVar2 + 1) = (char)uVar6;
          uVar2 = uVar2 + 1;
        } while (uVar2 < __n);
      }
      if (uVar2 == __n) {
        return local_38;
      }
    }
    if (0xffff < __n) {
      byteLength_00 = (__n >> 1) * uVar5;
LAB_00108cba:
      CVar4 = Col_NewRope(format,data,byteLength_00);
      right = Col_NewRope(format,(void *)((long)data + byteLength_00),byteLength - byteLength_00);
      CVar4 = Col_ConcatRopes(CVar4,right);
      return CVar4;
    }
    if (format != 0x24) goto LAB_00108c76;
    if (byteLength < uVar5) {
      pacVar3 = AllocCells(__n + 0x23 >> 5);
      *(char *)((long)pacVar3 + 0) = '\x06';
      *(char *)((long)pacVar3 + 1) = '\x01';
      *(undefined2 *)(*pacVar3 + 2) = uVar7;
      return (Col_Word)pacVar3;
    }
    uVar6 = 1;
    uVar2 = 0;
    while (uVar1 = *(uint *)((long)data + uVar2 * 4), uVar1 < 0x10000) {
      if (0xff < uVar1) {
        uVar6 = 2;
      }
      uVar2 = uVar2 + 1;
      if (__n <= uVar2) {
        pacVar3 = AllocCells(uVar6 * __n + 0x23 >> 5);
        (*pacVar3)[0] = '\x06';
        (*pacVar3)[1] = (char)uVar6;
        *(undefined2 *)(*pacVar3 + 2) = uVar7;
        if (uVar6 != 1) {
          if (byteLength < uVar5) {
            return (Col_Word)pacVar3;
          }
          uVar5 = 0;
          do {
            *(undefined2 *)(*pacVar3 + uVar5 * 2 + 4) = *(undefined2 *)((long)data + uVar5 * 4);
            uVar5 = uVar5 + 1;
          } while (uVar5 < __n);
          return (Col_Word)pacVar3;
        }
        if (byteLength < uVar5) {
          return (Col_Word)pacVar3;
        }
        uVar5 = 0;
        do {
          (*pacVar3)[uVar5 + 4] = *(char *)((long)data + uVar5 * 4);
          uVar5 = uVar5 + 1;
        } while (uVar5 < __n);
        return (Col_Word)pacVar3;
      }
    }
    byteLength = __n << 2;
    pacVar3 = AllocCells(__n * 4 + 0x23 >> 5);
    *(char *)((long)pacVar3 + 0) = '\x06';
    *(char *)((long)pacVar3 + 1) = '\x04';
  }
  *(undefined2 *)(*pacVar3 + 2) = uVar7;
  __dest = *pacVar3 + 4;
LAB_00108c96:
  memcpy(__dest,data,byteLength);
  return (Col_Word)pacVar3;
}

Assistant:

Col_Word
Col_NewRope(
    Col_StringFormat format,    /*!< Format of data in buffer. if #COL_UCS,
                                     data is provided as with #COL_UCS4 but
                                     will use #COL_UCS1 or #COL_UCS2 if data
                                     fits. */
    const void *data,           /*!< Buffer containing flat data. */
    size_t byteLength)          /*!< Length of data in bytes. */
{
    Col_Word rope;
    size_t length;
    size_t half=0;              /* Index of the split point. */

    /*
     * Quick cases.
     */

    if (byteLength == 0) {
        /* Empty string. */
        return WORD_SMALLSTR_EMPTY;
    }

    if (FORMAT_UTF(format)) {
        /*
         * Variable-width UTF-8/16 string.
         */

        const char *source = (const char *) data, *p;
        size_t codeUnits = byteLength / CHAR_WIDTH(format);
        if (byteLength <= UTFSTR_MAX_BYTELENGTH) {
            /*
             * String fits into one multi-cell leaf rope. We know the byte
             * length, now get the char length.
             */

            length = 0;
            for (p = source; p < source+byteLength; length++) {
                switch (format) {
                case COL_UTF8:  p = (const char *) Col_Utf8Next ((const Col_Char1 *) p); break;
                case COL_UTF16: p = (const char *) Col_Utf16Next((const Col_Char2 *) p); break;
                }
            }
            rope = (Col_Word) AllocCells(UTFSTR_SIZE(byteLength));
            WORD_UTFSTR_INIT(rope, format, length, byteLength);
            memcpy((void *) WORD_UTFSTR_DATA(rope), data, byteLength);
            return rope;
        }

        /*
         * Split data in half at char boundary.
         */

        p = source + (codeUnits/2 + 1) * CHAR_WIDTH(format);
        switch (format) {
        case COL_UTF8:  p = (const char *) Col_Utf8Prev ((const Col_Char1 *) p); break;
        case COL_UTF16: p = (const char *) Col_Utf16Prev((const Col_Char2 *) p); break;
        }
        half = p-source;
    } else {
        /*
         * Fixed-width UCS string.
         */

        length = byteLength / CHAR_WIDTH(format);
        if (length == 1) {
            /*
             * Single char.
             */

            switch (format) {
            case COL_UCS1: return WORD_CHAR_NEW(*(const Col_Char1 *) data, format);
            case COL_UCS2: return WORD_CHAR_NEW(*(const Col_Char2 *) data, format);
            case COL_UCS4: return WORD_CHAR_NEW(*(const Col_Char4 *) data, format);
            case COL_UCS: return Col_NewCharWord(*(const Col_Char4 *) data);
            }
        } else if (length <= SMALLSTR_MAX_LENGTH) {
            switch (format) {
            case COL_UCS1:
                /*
                 * Immediate string.
                 */

                WORD_SMALLSTR_SET_LENGTH(rope, length);
                memcpy(WORD_SMALLSTR_DATA(rope), data, length);
                return rope;

            case COL_UCS: {
                /*
                 * Use immediate string if possible.
                 */

                const Col_Char4 * string = (const Col_Char4 *) data;
                size_t i;
                WORD_SMALLSTR_SET_LENGTH(rope, length);
                for (i = 0; i < length; i++) {
                    if (string[i] > COL_CHAR1_MAX) break;
                    WORD_SMALLSTR_DATA(rope)[i] = (Col_Char1) string[i];
                }
                if (i == length) {
                    return rope;
                }
                break;
                }
            }
        }
        if (length <= UCSSTR_MAX_LENGTH) {
            /*
             * String fits into one multi-cell leaf rope.
             */

            if (format == COL_UCS) {
                /*
                 * Adaptive format.
                 */

                const Col_Char4 * string = (const Col_Char4 *) data;
                size_t i;
                format = COL_UCS1;
                for (i = 0; i < length; i++) {
                    if (string[i] > COL_CHAR2_MAX) {
                        format = COL_UCS4;
                        break;
                    } else if (string[i] > COL_CHAR1_MAX) {
                        format = COL_UCS2;
                    }
                }
                byteLength = length * CHAR_WIDTH(format);
                rope = (Col_Word) AllocCells(UCSSTR_SIZE(byteLength));
                WORD_UCSSTR_INIT(rope, format, length);
                switch (format) {
                case COL_UCS1: {
                    Col_Char1 * target
                            = (Col_Char1 *) WORD_UCSSTR_DATA(rope);
                    for (i = 0; i < length; i++) {
                        target[i] = string[i];
                    }
                    break;
                    }

                case COL_UCS2: {
                    Col_Char2 * target
                            = (Col_Char2 *) WORD_UCSSTR_DATA(rope);
                    for (i = 0; i < length; i++) {
                        target[i] = string[i];
                    }
                    break;
                    }

                case COL_UCS4:
                    memcpy((void *) WORD_UCSSTR_DATA(rope), data,
                            byteLength);
                    break;
                }
            } else {
                /*
                 * Fixed format.
                 */

                rope = (Col_Word) AllocCells(UCSSTR_SIZE(byteLength));
                WORD_UCSSTR_INIT(rope, format, length);
                memcpy((void *) WORD_UCSSTR_DATA(rope), data, byteLength);
            }
            return rope;
        }

        /*
         * Split data in half at char boundary.
         */

        half = (length/2) * CHAR_WIDTH(format);
    }

    /*
     * The rope is built by concatenating the two halves of the string. This
     * recursive halving ensures that the resulting binary tree is properly
     * balanced.
     */

    return Col_ConcatRopes(Col_NewRope(format, data, half),
            Col_NewRope(format, (const char *) data+half, byteLength-half));
}